

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions_with_masked_debug
          (CompilerGLSL *this,SPIRBlock *block)

{
  bool bVar1;
  
  bVar1 = this->block_debug_directives;
  this->block_debug_directives = true;
  emit_block_instructions(this,block);
  this->block_debug_directives = bVar1;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions_with_masked_debug(SPIRBlock &block)
{
	// Have to block debug instructions such as OpLine here, since it will be treated as a statement otherwise,
	// which breaks loop optimizations.
	// Any line directive would be declared outside the loop body, which would just be confusing either way.
	bool old_block_debug_directives = block_debug_directives;
	block_debug_directives = true;
	emit_block_instructions(block);
	block_debug_directives = old_block_debug_directives;
}